

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                   string *validation_name,string *item_name,
                   vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                   *objects_info,XrEnvironmentBlendMode value)

{
  return value - XR_ENVIRONMENT_BLEND_MODE_OPAQUE < 3;
}

Assistant:

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,
                    const std::string &command_name,
                    const std::string &validation_name,
                    const std::string &item_name,
                    std::vector<GenValidUsageXrObjectInfo>& objects_info,
                    const XrEnvironmentBlendMode value) {
    (void)instance_info;  // quiet warnings
    (void)command_name;  // quiet warnings
    (void)validation_name;  // quiet warnings
    (void)item_name;  // quiet warnings
    (void)objects_info;  // quiet warnings
    switch (value) {
        case XR_ENVIRONMENT_BLEND_MODE_OPAQUE:
            return true;
        case XR_ENVIRONMENT_BLEND_MODE_ADDITIVE:
            return true;
        case XR_ENVIRONMENT_BLEND_MODE_ALPHA_BLEND:
            return true;
    default:
        return false;
}
}